

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O1

void Omega_h::classify_by_angles(Mesh *mesh,Real sharp_angle)

{
  int *piVar1;
  uint uVar2;
  Alloc *pAVar3;
  LO LVar4;
  undefined8 uVar5;
  char *pcVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  LOs surf_hinge2hinge;
  Read<signed_char> side_is_exposed;
  Write<signed_char> hinge_is_sharp;
  LOs surf_side2side;
  Read<signed_char> hinge_is_exposed;
  Reals surf_side_normals;
  type f;
  Reals surf_hinge_angles;
  LOs side2surf_side;
  Alloc *local_228;
  void *local_220;
  Alloc *local_218;
  void *local_210;
  Write<signed_char> local_208;
  Alloc *local_1f8;
  void *local_1f0;
  Omega_h *local_1e8;
  Omega_h *local_1e0;
  Read<signed_char> local_1d8;
  LOs local_1c8;
  Alloc *local_1b8;
  void *local_1b0;
  undefined1 local_1a8 [32];
  Alloc *local_188;
  long local_180;
  Real local_178;
  Write<signed_char> local_170;
  LOs local_160;
  Reals local_150;
  Read<signed_char> local_140;
  LOs local_130;
  Alloc *local_120;
  void *local_118;
  Read<signed_char> local_110;
  Read<signed_char> local_100;
  Alloc *local_f0;
  void *local_e8;
  Alloc *local_e0;
  void *local_d8;
  Alloc *local_d0;
  long local_c8;
  Real local_c0;
  Alloc *local_b8;
  void *pvStack_b0;
  Alloc *local_a8;
  void *pvStack_a0;
  Alloc *local_98;
  long lStack_90;
  Real local_88;
  Read<signed_char> local_80;
  Alloc *local_70;
  long local_68;
  LOs local_60;
  Alloc *local_50;
  void *local_48;
  Read<signed_char> local_40;
  
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    uVar2 = mesh->dim_;
    if (uVar2 < 4) {
      classify_elements(mesh);
      mark_exposed_sides((Omega_h *)&local_218,mesh);
      local_100.write_.shared_alloc_.alloc = local_218;
      if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_100.write_.shared_alloc_.alloc = (Alloc *)(local_218->size * 8 + 1);
        }
        else {
          local_218->use_count = local_218->use_count + 1;
        }
      }
      local_100.write_.shared_alloc_.direct_ptr = local_210;
      classify_sides_by_exposure(mesh,&local_100);
      pAVar3 = local_100.write_.shared_alloc_.alloc;
      if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
          local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_100.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_100.write_.shared_alloc_.alloc);
          operator_delete(pAVar3,0x48);
        }
      }
      if (uVar2 != 1) {
        local_40.write_.shared_alloc_.alloc = local_218;
        if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_40.write_.shared_alloc_.alloc = (Alloc *)(local_218->size * 8 + 1);
          }
          else {
            local_218->use_count = local_218->use_count + 1;
          }
        }
        local_40.write_.shared_alloc_.direct_ptr = local_210;
        mark_down((Omega_h *)&local_1b8,mesh,uVar2 - 1,uVar2 - 2,&local_40);
        pAVar3 = local_40.write_.shared_alloc_.alloc;
        if (((ulong)local_40.write_.shared_alloc_.alloc & 7) == 0 &&
            local_40.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_40.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_40.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        local_110.write_.shared_alloc_.alloc = local_218;
        if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_110.write_.shared_alloc_.alloc = (Alloc *)(local_218->size * 8 + 1);
          }
          else {
            local_218->use_count = local_218->use_count + 1;
          }
        }
        local_110.write_.shared_alloc_.direct_ptr = local_210;
        local_1e0 = (Omega_h *)&local_1b8;
        collect_marked((Omega_h *)&local_1f8,&local_110);
        pAVar3 = local_110.write_.shared_alloc_.alloc;
        if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
            local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_110.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_110.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        local_130.write_.shared_alloc_.alloc = local_1f8;
        if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_130.write_.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
          }
          else {
            local_1f8->use_count = local_1f8->use_count + 1;
          }
        }
        local_130.write_.shared_alloc_.direct_ptr = local_1f0;
        get_side_vectors((Omega_h *)&local_120,mesh,&local_130);
        pAVar3 = local_130.write_.shared_alloc_.alloc;
        if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
            local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_130.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_130.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        local_140.write_.shared_alloc_.alloc = local_1b8;
        if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_140.write_.shared_alloc_.alloc = (Alloc *)(local_1b8->size * 8 + 1);
          }
          else {
            local_1b8->use_count = local_1b8->use_count + 1;
          }
        }
        local_140.write_.shared_alloc_.direct_ptr = local_1b0;
        collect_marked((Omega_h *)&local_228,&local_140);
        pAVar3 = local_140.write_.shared_alloc_.alloc;
        if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
            local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_140.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_140.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        if (((ulong)local_228 & 1) == 0) {
          uVar8 = local_228->size;
        }
        else {
          uVar8 = (ulong)local_228 >> 3;
        }
        LVar4 = Mesh::nents(mesh,uVar2 - 1);
        local_60.write_.shared_alloc_.alloc = local_1f8;
        if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_60.write_.shared_alloc_.alloc = (Alloc *)(local_1f8->size * 8 + 1);
          }
          else {
            local_1f8->use_count = local_1f8->use_count + 1;
          }
        }
        local_60.write_.shared_alloc_.direct_ptr = local_1f0;
        invert_injective_map((Omega_h *)&local_50,&local_60,LVar4);
        pAVar3 = local_60.write_.shared_alloc_.alloc;
        if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
            local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        local_150.write_.shared_alloc_.alloc = local_120;
        if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_150.write_.shared_alloc_.alloc = (Alloc *)(local_120->size * 8 + 1);
          }
          else {
            local_120->use_count = local_120->use_count + 1;
          }
        }
        local_150.write_.shared_alloc_.direct_ptr = local_118;
        local_1c8.write_.shared_alloc_.alloc = local_228;
        if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1c8.write_.shared_alloc_.alloc = (Alloc *)(local_228->size * 8 + 1);
          }
          else {
            local_228->use_count = local_228->use_count + 1;
          }
        }
        local_1c8.write_.shared_alloc_.direct_ptr = local_220;
        local_160.write_.shared_alloc_.alloc = local_50;
        if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_160.write_.shared_alloc_.alloc = (Alloc *)(local_50->size * 8 + 1);
          }
          else {
            local_50->use_count = local_50->use_count + 1;
          }
        }
        local_160.write_.shared_alloc_.direct_ptr = local_48;
        local_1e8 = (Omega_h *)&local_50;
        get_hinge_angles((Omega_h *)&local_70,mesh,&local_150,&local_1c8,&local_160);
        pAVar3 = local_160.write_.shared_alloc_.alloc;
        if (((ulong)local_160.write_.shared_alloc_.alloc & 7) == 0 &&
            local_160.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_160.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_160.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_1c8.write_.shared_alloc_.alloc;
        if (((ulong)local_1c8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_1c8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1c8.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_150.write_.shared_alloc_.alloc;
        if (((ulong)local_150.write_.shared_alloc_.alloc & 7) == 0 &&
            local_150.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_150.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_150.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        LVar4 = Mesh::nents(mesh,uVar2 - 2);
        local_1a8._0_8_ = (Alloc *)(local_1a8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        Write<signed_char>::Write(&local_208,LVar4,'\0',(string *)local_1a8);
        if ((Alloc *)local_1a8._0_8_ != (Alloc *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
        }
        local_f0 = local_228;
        if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_f0 = (Alloc *)(local_228->size * 8 + 1);
          }
          else {
            local_228->use_count = local_228->use_count + 1;
          }
        }
        local_e8 = local_220;
        local_e0 = local_208.shared_alloc_.alloc;
        if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
            local_208.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_e0 = (Alloc *)((local_208.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_208.shared_alloc_.alloc)->use_count =
                 (local_208.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_d8 = local_208.shared_alloc_.direct_ptr;
        local_d0 = local_70;
        if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_d0 = (Alloc *)(local_70->size * 8 + 1);
          }
          else {
            local_70->use_count = local_70->use_count + 1;
          }
        }
        local_c8 = local_68;
        local_b8 = local_f0;
        if (((ulong)local_f0 & 7) == 0 && local_f0 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8 = (Alloc *)(local_f0->size * 8 + 1);
          }
          else {
            local_f0->use_count = local_f0->use_count + 1;
          }
        }
        pvStack_b0 = local_220;
        local_a8 = local_e0;
        if (((ulong)local_e0 & 7) == 0 && local_e0 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_a8 = (Alloc *)(local_e0->size * 8 + 1);
          }
          else {
            local_e0->use_count = local_e0->use_count + 1;
          }
        }
        pvStack_a0 = local_208.shared_alloc_.direct_ptr;
        local_98 = local_d0;
        if (((ulong)local_d0 & 7) == 0 && local_d0 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_98 = (Alloc *)(local_d0->size * 8 + 1);
          }
          else {
            local_d0->use_count = local_d0->use_count + 1;
          }
        }
        lStack_90 = local_68;
        iVar7 = (int)(uVar8 >> 2);
        local_c0 = sharp_angle;
        local_88 = sharp_angle;
        if (0 < iVar7) {
          local_1a8._0_8_ = local_b8;
          local_1a8._8_8_ = local_220;
          if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
            local_b8->use_count = local_b8->use_count + -1;
            local_1a8._0_8_ = local_b8->size * 8 + 1;
          }
          local_b8 = (Alloc *)0x0;
          pvStack_b0 = (void *)0x0;
          local_1a8._16_8_ = local_a8;
          local_1a8._24_8_ = local_208.shared_alloc_.direct_ptr;
          if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
            local_a8->use_count = local_a8->use_count + -1;
            local_1a8._16_8_ = local_a8->size * 8 + 1;
          }
          local_a8 = (Alloc *)0x0;
          pvStack_a0 = (void *)0x0;
          local_188 = local_98;
          local_180 = local_68;
          if (((ulong)local_98 & 7) == 0 && local_98 != (Alloc *)0x0) {
            local_98->use_count = local_98->use_count + -1;
            local_188 = (Alloc *)(local_98->size * 8 + 1);
          }
          local_98 = (Alloc *)0x0;
          lStack_90 = 0;
          entering_parallel = '\0';
          lVar9 = 0;
          do {
            *(bool *)((long)local_208.shared_alloc_.direct_ptr +
                     (long)*(int *)((long)local_220 + lVar9 * 4)) =
                 sharp_angle <= *(double *)(local_68 + lVar9 * 8);
            lVar9 = lVar9 + 1;
          } while (iVar7 != (int)lVar9);
          local_178 = sharp_angle;
          classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)local_1a8);
        }
        classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_b8);
        local_1d8.write_.shared_alloc_.alloc = local_1b8;
        if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_1d8.write_.shared_alloc_.alloc = (Alloc *)(local_1b8->size * 8 + 1);
          }
          else {
            local_1b8->use_count = local_1b8->use_count + 1;
          }
        }
        local_1d8.write_.shared_alloc_.direct_ptr = local_1b0;
        local_170.shared_alloc_.alloc = local_208.shared_alloc_.alloc;
        if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
            local_208.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_170.shared_alloc_.alloc = (Alloc *)((local_208.shared_alloc_.alloc)->size * 8 + 1)
            ;
          }
          else {
            (local_208.shared_alloc_.alloc)->use_count =
                 (local_208.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_170.shared_alloc_.direct_ptr = local_208.shared_alloc_.direct_ptr;
        Read<signed_char>::Read(&local_80,&local_170);
        classify_hinges_by_sharpness(mesh,&local_1d8,&local_80);
        if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
            local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
            operator_delete(local_80.write_.shared_alloc_.alloc,0x48);
          }
        }
        pAVar3 = local_170.shared_alloc_.alloc;
        if (((ulong)local_170.shared_alloc_.alloc & 7) == 0 &&
            local_170.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_170.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_170.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        pAVar3 = local_1d8.write_.shared_alloc_.alloc;
        if (((ulong)local_1d8.write_.shared_alloc_.alloc & 7) == 0 &&
            local_1d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_1d8.write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1d8.write_.shared_alloc_.alloc);
            operator_delete(pAVar3,0x48);
          }
        }
        if (uVar2 != 2) {
          finalize_classification(mesh);
        }
        classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)&local_f0);
        if (((ulong)local_208.shared_alloc_.alloc & 7) == 0 &&
            local_208.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_208.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_208.shared_alloc_.alloc);
            operator_delete(local_208.shared_alloc_.alloc,0x48);
          }
        }
        if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
          piVar1 = &local_70->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_70);
            operator_delete(local_70,0x48);
          }
        }
        if (((ulong)local_50 & 7) == 0 && local_50 != (Alloc *)0x0) {
          piVar1 = &local_50->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_50);
            operator_delete(local_50,0x48);
          }
        }
        if (((ulong)local_228 & 7) == 0 && local_228 != (Alloc *)0x0) {
          piVar1 = &local_228->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_228);
            operator_delete(local_228,0x48);
          }
        }
        if (((ulong)local_120 & 7) == 0 && local_120 != (Alloc *)0x0) {
          piVar1 = &local_120->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_120);
            operator_delete(local_120,0x48);
          }
        }
        if (((ulong)local_1f8 & 7) == 0 && local_1f8 != (Alloc *)0x0) {
          piVar1 = &local_1f8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1f8);
            operator_delete(local_1f8,0x48);
          }
        }
        if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (Alloc *)0x0) {
          piVar1 = &local_1b8->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_1b8);
            operator_delete(local_1b8,0x48);
          }
        }
      }
      if (((ulong)local_218 & 7) == 0 && local_218 != (Alloc *)0x0) {
        piVar1 = &local_218->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_218);
          operator_delete(local_218,0x48);
        }
      }
      return;
    }
    pcVar10 = "0 <= dim_ && dim_ <= 3";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar5 = 0x33;
  }
  else {
    pcVar10 = "mesh->family() == OMEGA_H_SIMPLEX";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_class.cpp"
    ;
    uVar5 = 0x2b;
  }
  fail("assertion %s failed at %s +%d\n",pcVar10,pcVar6,uVar5);
}

Assistant:

void classify_by_angles(Mesh* mesh, Real sharp_angle) {
  OMEGA_H_CHECK(mesh->family() == OMEGA_H_SIMPLEX);
  auto dim = mesh->dim();
  classify_elements(mesh);
  auto side_is_exposed = mark_exposed_sides(mesh);
  classify_sides_by_exposure(mesh, side_is_exposed);
  if (dim == 1) return;
  auto hinge_is_exposed = mark_down(mesh, dim - 1, dim - 2, side_is_exposed);
  auto surf_side2side = collect_marked(side_is_exposed);
  auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
  auto surf_hinge2hinge = collect_marked(hinge_is_exposed);
  auto nsurf_hinges = surf_hinge2hinge.size();
  auto nsides = mesh->nents(dim - 1);
  auto side2surf_side = invert_injective_map(surf_side2side, nsides);
  auto surf_hinge_angles = get_hinge_angles(
      mesh, surf_side_normals, surf_hinge2hinge, side2surf_side);
  auto nhinges = mesh->nents(dim - 2);
  Write<I8> hinge_is_sharp(nhinges, 0);
  auto f = OMEGA_H_LAMBDA(LO surf_hinge) {
    LO hinge = surf_hinge2hinge[surf_hinge];
    hinge_is_sharp[hinge] = (surf_hinge_angles[surf_hinge] >= sharp_angle);
  };
  parallel_for(nsurf_hinges, f, "classify_by_angles(is_sharp)");
  classify_hinges_by_sharpness(mesh, hinge_is_exposed, hinge_is_sharp);
  if (dim == 2) return;
  finalize_classification(mesh);
}